

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

Type * __thiscall soul::AST::Constant::getResultType(Constant *this)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  PrimitiveType PVar5;
  BoundedIntSize BVar6;
  Type *in_RDI;
  
  CVar2 = (this->value).type.arrayElementCategory;
  bVar3 = (this->value).type.isRef;
  bVar4 = (this->value).type.isConstant;
  PVar5.type = (this->value).type.primitiveType.type;
  in_RDI->category = (this->value).type.category;
  in_RDI->arrayElementCategory = CVar2;
  in_RDI->isRef = bVar3;
  in_RDI->isConstant = bVar4;
  in_RDI->primitiveType = (PrimitiveType)PVar5.type;
  BVar6 = (this->value).type.arrayElementBoundingSize;
  in_RDI->boundingSize = (this->value).type.boundingSize;
  in_RDI->arrayElementBoundingSize = BVar6;
  pSVar1 = (this->value).type.structure.object;
  (in_RDI->structure).object = pSVar1;
  if (pSVar1 != (Structure *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  return in_RDI;
}

Assistant:

Type getResultType() const override                 { return value.getType(); }